

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

bool __thiscall RowSampler::sample(RowSampler *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  uVar3 = this->_step;
  bVar5 = true;
  if (uVar3 != 1) {
    uVar1 = this->_count + 1;
    this->_count = uVar1;
    if (uVar1 == this->_next) {
      uVar1 = this->_sampled + 1;
      this->_sampled = uVar1;
      iVar4 = 1;
      if (this->_mode == RANDOM) {
        uVar2 = rand();
        uVar1 = this->_sampled;
        uVar3 = this->_step;
        iVar4 = uVar2 % uVar3 + 1;
      }
      this->_next = uVar3 * uVar1 + iVar4;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool
    sample()
    {
        // Don't bother if samling every row
        if (this->_step == 1) return true;

        // Bump row counter
        this->_count++;

        // Check if this row is sampled
        if (this->_count == this->_next)
        {
            // Bump sampled counter
            this->_sampled++;

            // If yes, determine next row in this sampling bin to sample
            unsigned int row = 1;
            if (this->_mode == SamplerOptions::RANDOM)
            {
                row = 1 + (unsigned int)(rand() % this->_step);
            }
            this->_next = this->_sampled * this->_step + row;

            return true;
        }

        return false;

    }